

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BooPHF.h
# Opt level: O3

void __thiscall
boomphf::mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_>::setup
          (mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_> *this)

{
  uint64_t uVar1;
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  uint5 uVar8;
  __pid_t _Var9;
  pthread_t pVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  int ii;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [16];
  
  pthread_mutex_init((pthread_mutex_t *)&this->_mutex,(pthread_mutexattr_t *)0x0);
  _Var9 = getpid();
  pVar10 = pthread_self();
  auVar5[0xc] = (char)(pVar10 >> 0x18);
  auVar5._0_12_ = ZEXT812(0);
  uVar8 = CONCAT32(auVar5._10_3_,(ushort)(byte)(pVar10 >> 0x10));
  auVar6._5_8_ = 0;
  auVar6._0_5_ = uVar8;
  uVar11 = pVar10 >> 0x20 & 0xff;
  auVar2._8_4_ = 0;
  auVar2._0_8_ = uVar11;
  auVar2[0xc] = (char)(pVar10 >> 0x38);
  auVar3[8] = (char)(pVar10 >> 0x30);
  auVar3._0_8_ = uVar11;
  auVar3[9] = 0;
  auVar3._10_3_ = auVar2._10_3_;
  auVar7._5_8_ = 0;
  auVar7._0_5_ = auVar3._8_5_;
  auVar4[4] = (char)(pVar10 >> 0x28);
  auVar4._0_4_ = (int)uVar11;
  auVar4[5] = 0;
  auVar4._6_7_ = SUB137(auVar7 << 0x40,6);
  this->_pid = (uint)(uint3)(auVar2._10_3_ >> 0x10) + (uint)(uint3)(auVar5._10_3_ >> 0x10) +
               auVar4._4_4_ + (int)CONCAT72(SUB137(auVar6 << 0x40,6),(ushort)(byte)(pVar10 >> 8)) +
               auVar3._8_4_ + (int)uVar8 + (int)uVar11 + (uint)(byte)pVar10 + _Var9;
  this->_cptTotalProcessed = 0;
  if (this->_fastmode == true) {
    auVar18._0_8_ = (double)CONCAT44(0x43300000,(int)this->_nelem);
    auVar18._8_4_ = (int)(this->_nelem >> 0x20);
    auVar18._12_4_ = 0x45300000;
    dVar19 = ((auVar18._8_8_ - 1.9342813113834067e+25) + (auVar18._0_8_ - 4503599627370496.0)) *
             (double)this->_percent_elem_loaded_for_fastMode;
    uVar11 = (ulong)dVar19;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&this->setLevelFastmode,
               (long)(dVar19 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f | uVar11);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(&this->bufferperThread,(long)this->_num_thread);
  if ((this->_writeEachLevel == true) && (0 < this->_num_thread)) {
    lVar13 = 0;
    lVar15 = 0;
    do {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 ((long)&(((this->bufferperThread).
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data + lVar13),10000);
      lVar15 = lVar15 + 1;
      lVar13 = lVar13 + 0x18;
    } while (lVar15 < this->_num_thread);
  }
  uVar1 = this->_nelem;
  auVar16._8_4_ = (int)(uVar1 >> 0x20);
  auVar16._0_8_ = uVar1;
  auVar16._12_4_ = 0x45300000;
  dVar19 = ((auVar16._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * this->_gamma;
  lVar13 = uVar1 - 1;
  auVar20._8_4_ = (int)((ulong)lVar13 >> 0x20);
  auVar20._0_8_ = lVar13;
  auVar20._12_4_ = 0x45300000;
  dVar19 = pow((dVar19 + -1.0) / dVar19,
               (auVar20._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0));
  this->_proba_collision = 1.0 - dVar19;
  this->_nb_levels = 0x19;
  std::vector<boomphf::level,_std::allocator<boomphf::level>_>::resize(&this->_levels,0x19);
  if (0 < this->_nb_levels) {
    lVar14 = 0;
    lVar13 = 0;
    lVar15 = 0;
    do {
      *(long *)((long)&((this->_levels).
                        super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
                        super__Vector_impl_data._M_start)->idx_begin + lVar14) = lVar15;
      auVar17._0_8_ = (double)CONCAT44(0x43300000,(int)this->_hash_domain);
      auVar17._8_4_ = (int)(this->_hash_domain >> 0x20);
      auVar17._12_4_ = 0x45300000;
      dVar19 = pow(this->_proba_collision,(double)(int)lVar13);
      dVar19 = dVar19 * ((auVar17._8_8_ - 1.9342813113834067e+25) +
                        (auVar17._0_8_ - 4503599627370496.0));
      uVar11 = (ulong)dVar19;
      uVar11 = ((long)(dVar19 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f | uVar11) + 0x3f &
               0xffffffffffffffc0;
      if (uVar11 == 0) {
        uVar11 = 0x40;
      }
      *(ulong *)((long)&((this->_levels).
                         super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl
                         .super__Vector_impl_data._M_start)->hash_domain + lVar14) = uVar11;
      lVar15 = lVar15 + uVar11;
      lVar13 = lVar13 + 1;
      lVar14 = lVar14 + 0x40;
    } while (lVar13 < this->_nb_levels);
    if (0 < this->_nb_levels) {
      iVar12 = 0;
      do {
        dVar19 = pow(this->_proba_collision,(double)iVar12);
        if (dVar19 < (double)this->_percent_elem_loaded_for_fastMode) {
          this->_fastModeLevel = iVar12;
          return;
        }
        iVar12 = iVar12 + 1;
      } while (iVar12 < this->_nb_levels);
    }
  }
  return;
}

Assistant:

void setup()
		{
			pthread_mutex_init(&_mutex, NULL);

			_pid = getpid() + printPt(pthread_self()) ;// + pthread_self();
			//printf("pt self %llu  pid %i \n",printPt(pthread_self()),_pid);

			_cptTotalProcessed=0;

			
			if(_fastmode)
			{
				setLevelFastmode.resize(_percent_elem_loaded_for_fastMode * (double)_nelem );
			}

			
			bufferperThread.resize(_num_thread);
			if(_writeEachLevel)
			{
				for(int ii=0; ii<_num_thread; ii++)
				{
					bufferperThread[ii].resize(NBBUFF);
				}
			}
			
			_proba_collision = 1.0 -  pow(((_gamma*(double)_nelem -1 ) / (_gamma*(double)_nelem)),_nelem-1);

			double sum_geom =_gamma * ( 1.0 +  _proba_collision / (1.0 - _proba_collision));
			//printf("proba collision %f  sum_geom  %f   \n",_proba_collision,sum_geom);

			_nb_levels = 25;
			_levels.resize(_nb_levels);

			//build levels
			uint64_t previous_idx =0;
			for(int ii=0; ii<_nb_levels; ii++)
			{

				_levels[ii].idx_begin = previous_idx;

				// round size to nearest superior multiple of 64, makes it easier to clear a level
				_levels[ii].hash_domain =  (( (uint64_t) (_hash_domain * pow(_proba_collision,ii)) + 63) / 64 ) * 64;
				if(_levels[ii].hash_domain == 0 ) _levels[ii].hash_domain  = 64 ;
				previous_idx += _levels[ii].hash_domain;

				//printf("build level %i bit array : start %12llu, size %12llu  ",ii,_levels[ii]->idx_begin,_levels[ii]->hash_domain );
				//printf(" expected elems : %.2f %% total \n",100.0*pow(_proba_collision,ii));

			}
			
			for(int ii=0; ii<_nb_levels; ii++)
			{
				 if(pow(_proba_collision,ii) < _percent_elem_loaded_for_fastMode)
				 {
				 	_fastModeLevel = ii;
				 	 //printf("fast mode level :  %i \n",ii);
				 	break;
				 }
			}
		}